

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O2

void __thiscall dgrminer::PartialUnion::printAll(PartialUnion *this)

{
  pointer paVar1;
  pointer paVar2;
  bool bVar3;
  ostream *poVar4;
  int i;
  long lVar5;
  bool bVar6;
  int i_1;
  pointer paVar7;
  pointer paVar8;
  ulong uVar9;
  array<int,_6UL> var;
  
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "NODES (TIME, ID, LABEL, DELETED, CHANGETIME, CHANGETIMELINK):");
  std::endl<char,std::char_traits<char>>(poVar4);
  paVar1 = (this->nodes).
           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar9 = 0;
  bVar6 = false;
  for (paVar7 = (this->nodes).
                super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start; paVar7 != paVar1; paVar7 = paVar7 + 1) {
    var._M_elems._16_8_ = *(undefined8 *)(paVar7->_M_elems + 4);
    var._M_elems._0_8_ = *(undefined8 *)paVar7->_M_elems;
    var._M_elems._8_8_ = *(undefined8 *)(paVar7->_M_elems + 2);
    if (uVar9 < 0x33) {
LAB_00149bca:
      for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
        poVar4 = (ostream *)std::ostream::operator<<(&std::cout,var._M_elems[lVar5]);
        std::operator<<(poVar4,"\t");
      }
      poVar4 = (ostream *)&std::cout;
LAB_00149bf1:
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      if (((long)(this->nodes).
                 super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->nodes).
                super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x18 - 0x14U <= uVar9)
      goto LAB_00149bca;
      bVar3 = !bVar6;
      bVar6 = true;
      if (bVar3) {
        poVar4 = std::operator<<((ostream *)&std::cout,"...");
        bVar6 = true;
        goto LAB_00149bf1;
      }
    }
    uVar9 = uVar9 + 1;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "EDGES (TIME, SRC, DST, LABEL, DIRECTION, DELETED, CHANGETIME, ID):");
  std::endl<char,std::char_traits<char>>(poVar4);
  paVar8 = (this->edges).
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar2 = (this->edges).
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar9 = 0;
  bVar6 = false;
  do {
    if (paVar8 == paVar2) {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      printEncoding(this);
      return;
    }
    var._M_elems._16_8_ = *(undefined8 *)(paVar8->_M_elems + 4);
    var._M_elems._0_8_ = *(undefined8 *)paVar8->_M_elems;
    var._M_elems._8_8_ = *(undefined8 *)(paVar8->_M_elems + 2);
    if ((uVar9 < 0x33) ||
       (((long)(this->edges).
               super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(this->edges).
               super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start >> 5) - 0x14U <= uVar9)) {
      for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
        poVar4 = (ostream *)std::ostream::operator<<(&std::cout,var._M_elems[lVar5]);
        std::operator<<(poVar4,"\t");
      }
      poVar4 = (ostream *)&std::cout;
LAB_00149ccb:
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      bVar3 = !bVar6;
      bVar6 = true;
      if (bVar3) {
        poVar4 = std::operator<<((ostream *)&std::cout,"...");
        bVar6 = true;
        goto LAB_00149ccb;
      }
    }
    uVar9 = uVar9 + 1;
    paVar8 = paVar8 + 1;
  } while( true );
}

Assistant:

void PartialUnion::printAll() {
		using namespace std;

		int MAX_LIMIT = 50;

		int limit = 0;

		bool printed_dots = false;

		cout << "NODES (TIME, ID, LABEL, DELETED, CHANGETIME, CHANGETIMELINK):" << endl;
		for (array<int, 6> var : nodes)
		{
			if (limit > MAX_LIMIT && limit < nodes.size() - 20)
			{
				if (!printed_dots)
				{
					cout << "..." << endl;
					printed_dots = true;
				}
				limit++;
				continue;
			}
			for (int i = 0; i < 6; i++)
			{
				cout << var[i] << "\t";
			}
			cout << endl;

			limit++;

		}
		cout << endl;

		printed_dots = false;
		limit = 0;

		cout << "EDGES (TIME, SRC, DST, LABEL, DIRECTION, DELETED, CHANGETIME, ID):" << endl;
		for (array<int, 8> var : edges)
		{
			if (limit > MAX_LIMIT && limit < edges.size() - 20)
			{
				if (!printed_dots)
				{
					cout << "..." << endl;
					printed_dots = true;
				}
				limit++;
				continue;
			}
			for (int i = 0; i < 8; i++)
			{
				cout << var[i] << "\t";
			}
			cout << endl;

			limit++;
		}
		cout << endl;

		printEncoding();

	}